

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_xattr.c
# Opt level: O2

int fwrite_xattr(CURL *curl,char *url,int fd)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  char *value;
  char *local_38;
  
  local_38 = url;
  iVar2 = xattr(fd,"user.creator","curl");
  lVar4 = 0;
  while( true ) {
    if (iVar2 != 0) {
      return iVar2;
    }
    if (lVar4 == 0x20) break;
    pcVar1 = *(char **)((long)&mappings[0].attr + lVar4);
    value = (char *)0x0;
    iVar2 = 0;
    iVar3 = curl_easy_getinfo(curl,*(undefined4 *)((long)&mappings[0].info + lVar4),&value);
    if (value != (char *)0x0 && iVar3 == 0) {
      iVar2 = xattr(fd,pcVar1,value);
    }
    lVar4 = lVar4 + 0x10;
  }
  lVar4 = curl_url();
  if ((((lVar4 == 0) || (iVar2 = curl_url_set(lVar4,0,local_38,0x200), iVar2 != 0)) ||
      (iVar2 = curl_url_set(lVar4,2,0,0), iVar2 != 0)) ||
     ((iVar2 = curl_url_set(lVar4,3,0,0), iVar2 != 0 ||
      (iVar2 = curl_url_get(lVar4,0,&value,0), iVar2 != 0)))) {
    curl_url_cleanup(lVar4);
  }
  else {
    curl_url_cleanup(lVar4);
    pcVar1 = value;
    if (value != (char *)0x0) {
      iVar2 = xattr(fd,"user.xdg.origin.url",value);
      curl_free(pcVar1);
      return iVar2;
    }
  }
  return 1;
}

Assistant:

int fwrite_xattr(CURL *curl, const char *url, int fd)
{
  int i = 0;
  int err = xattr(fd, "user.creator", "curl");

  /* loop through all xattr-curlinfo pairs and abort on a set error */
  while(!err && mappings[i].attr) {
    char *value = NULL;
    CURLcode result = curl_easy_getinfo(curl, mappings[i].info, &value);
    if(!result && value)
      err = xattr(fd, mappings[i].attr, value);
    i++;
  }
  if(!err) {
    char *nurl = stripcredentials(url);
    if(!nurl)
      return 1;
    err = xattr(fd, "user.xdg.origin.url", nurl);
    curl_free(nurl);
  }
  return err;
}